

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

void envy_bios_print_mem_train_ptrn(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  char *__format;
  envy_bios_mem_train_ptrn_entry *peVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  
  uVar3 = (bios->mem).train_ptrn.offset;
  if ((mask >> 0xc & 1) != 0 && uVar3 != 0) {
    fprintf((FILE *)out,"MEM TRAIN PATTERN table at 0x%x, version %x\n",(ulong)uVar3,
            (ulong)(bios->mem).train_ptrn.version);
    envy_bios_dump_hex(bios,out,(uint)(bios->mem).train_ptrn.offset,
                       (uint)(bios->mem).train_ptrn.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    if ((bios->mem).train_ptrn.entriesnum != '\0') {
      uVar12 = 0;
      do {
        peVar8 = (bios->mem).train_ptrn.entries;
        fprintf((FILE *)out,"Set %2i: %u bits, modulo %u",uVar12 & 0xffffffff,
                (ulong)peVar8[uVar12].bits,(ulong)peVar8[uVar12].modulo);
        peVar8 = (bios->mem).train_ptrn.entries;
        __format = ". indirect(%2d)\n";
        uVar4 = (ulong)peVar8[uVar12].indirect_entry;
        if (peVar8[uVar12].indirect == '\0') {
          __format = ". direct(%2d)\n";
          uVar4 = uVar12;
        }
        bVar1 = peVar8[uVar4].bits;
        uVar3 = peVar8[uVar4].offset;
        fprintf((FILE *)out,__format);
        envy_bios_dump_hex(bios,out,(uint)(bios->mem).train_ptrn.entries[uVar12].offset,
                           (uint)(bios->mem).train_ptrn.rlen,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
        peVar8 = (bios->mem).train_ptrn.entries;
        if (peVar8[uVar12].modulo != '\0') {
          peVar8 = peVar8 + uVar12;
          uVar11 = 0;
          do {
            bVar7 = (bios->mem).train_ptrn.rlen;
            uVar5 = bios->length;
            uVar9 = uVar11;
            if (peVar8->indirect != '\0') {
              bVar2 = peVar8->bits;
              uVar9 = bVar2 * uVar11;
              lVar6 = (ulong)(uVar9 >> 3) + (ulong)((uint)peVar8->offset + (uint)bVar7);
              if ((int)lVar6 + 3U < uVar5) {
                uVar10 = *(uint *)(bios->data + lVar6);
              }
              else {
                uVar10 = 0;
                fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
                bVar7 = (bios->mem).train_ptrn.rlen;
                uVar5 = bios->length;
              }
              uVar9 = uVar10 >> ((byte)uVar9 & 7) & ~(uint)(-1L << (bVar2 & 0x3f));
            }
            uVar10 = uVar9 * bVar1;
            lVar6 = (ulong)(uVar10 >> 3 & 0xffff) + (ulong)((uint)bVar7 + (uint)uVar3);
            if ((int)lVar6 + 3U < uVar5) {
              uVar5 = *(uint *)(bios->data + lVar6);
            }
            else {
              uVar5 = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
            }
            fprintf((FILE *)out,"  %2u: [%08x]\n",(ulong)uVar9,
                    (ulong)(uVar5 >> ((byte)uVar10 & 7) & ~(uint)(-1L << (bVar1 & 0x3f))));
            uVar11 = uVar11 + 1;
            peVar8 = (bios->mem).train_ptrn.entries + uVar12;
          } while (uVar11 < peVar8->modulo);
        }
        fputc(10,(FILE *)out);
        uVar12 = uVar12 + 1;
      } while (uVar12 < (bios->mem).train_ptrn.entriesnum);
    }
  }
  return;
}

Assistant:

void
envy_bios_print_mem_train_ptrn(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem_train_ptrn *mtp = &bios->mem.train_ptrn;
	int i, j;
	uint32_t data, idx;
	uint16_t data_off;
	uint8_t bits;

	if (!mtp->offset || !(mask & ENVY_BIOS_PRINT_MEM))
		return;

	fprintf(out, "MEM TRAIN PATTERN table at 0x%x, version %x\n", mtp->offset, mtp->version);
	envy_bios_dump_hex(bios, out, mtp->offset, mtp->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < mtp->entriesnum; i++) {
		data_off = mtp->entries[i].offset;
		bits = mtp->entries[i].bits;
		fprintf(out, "Set %2i: %u bits, modulo %u", i, mtp->entries[i].bits, mtp->entries[i].modulo);
		if (mtp->entries[i].indirect) {
			data_off = mtp->entries[mtp->entries[i].indirect_entry].offset;
			bits = mtp->entries[mtp->entries[i].indirect_entry].bits;
			fprintf(out, ". indirect(%2d)\n", mtp->entries[i].indirect_entry);
		} else {
			data_off = mtp->entries[i].offset;
			bits = mtp->entries[i].bits;
			fprintf(out, ". direct(%2d)\n", mtp->entries[i].indirect_entry);
		}
		envy_bios_dump_hex(bios, out, mtp->entries[i].offset, mtp->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

		for (j = 0; j < mtp->entries[i].modulo; j++) {
			uint32_t p_bits;
			uint32_t mask;
			uint16_t off;
			uint8_t  mod;

			if (mtp->entries[i].indirect) {
				p_bits = j * mtp->entries[i].bits;
				mask = (1ULL << mtp->entries[i].bits) - 1;
				off = p_bits / 8;
				mod = p_bits % 8;

				bios_u32(bios, mtp->entries[i].offset + mtp->rlen + off, &idx);
				idx = idx >> mod;
				idx = idx & mask;
			} else {
				idx = j;
			}

			p_bits = idx * bits;
			mask = (1ULL << bits) - 1;
			off = p_bits / 8;
			mod = p_bits % 8;

			bios_u32(bios, data_off + mtp->rlen + off, &data);
			data = data >> mod;
			data = data & mask;

			fprintf(out, "  %2u: [%08x]\n", idx, data);
		}
		fprintf(out, "\n");
	}

}